

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

bool __thiscall units::precise_unit::operator==(precise_unit *this,precise_unit *other)

{
  bool bVar1;
  double *in_RSI;
  unit_data *in_RDI;
  unit_data *in_stack_ffffffffffffffd8;
  unit_data *val2;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  val2 = in_RDI;
  bVar1 = units::detail::unit_data::operator!=(in_RDI,in_stack_ffffffffffffffd8);
  if ((bVar1) || (in_RDI[3] != *(unit_data *)((long)in_RSI + 0xc))) {
    bVar1 = false;
  }
  else if ((*(double *)in_RDI != *in_RSI) || (NAN(*(double *)in_RDI) || NAN(*in_RSI))) {
    bVar1 = units::detail::compare_round_equals_precise
                      ((double)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (double)val2);
  }
  else {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool operator==(const precise_unit& other) const
    {
        if (base_units_ != other.base_units_ ||
            commodity_ != other.commodity_) {
            return false;
        }
        if (multiplier_ == other.multiplier_) {
            return true;
        }
        return detail::compare_round_equals_precise(
            multiplier_, other.multiplier_);
    }